

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O3

void __thiscall MemoryManager::printInfo(MemoryManager *this)

{
  uint uVar1;
  uint uVar2;
  uint32_t i;
  long lVar3;
  uint32_t j;
  long lVar4;
  
  puts("Memory Pages: ");
  uVar1 = 0x1000;
  lVar3 = 0;
  do {
    if (this->memory[lVar3] != (uint8_t **)0x0) {
      uVar2 = (int)lVar3 * 0x400000;
      printf("0x%x-0x%x:\n",(ulong)uVar2,(ulong)(uVar2 + 0x400000));
      lVar4 = 0;
      uVar2 = uVar1;
      do {
        if (this->memory[lVar3][lVar4] != (uint8_t *)0x0) {
          printf("  0x%x-0x%x\n",(ulong)(uVar2 - 0x1000),(ulong)uVar2);
        }
        lVar4 = lVar4 + 1;
        uVar2 = uVar2 + 0x1000;
      } while (lVar4 != 0x400);
    }
    lVar3 = lVar3 + 1;
    uVar1 = uVar1 + 0x400000;
  } while (lVar3 != 0x400);
  return;
}

Assistant:

void MemoryManager::printInfo() {
  printf("Memory Pages: \n");
  for (uint32_t i = 0; i < 1024; ++i) {
    if (this->memory[i] == nullptr) {
      continue;
    }
    printf("0x%x-0x%x:\n", i << 22, (i + 1) << 22);
    for (uint32_t j = 0; j < 1024; ++j) {
      if (this->memory[i][j] == nullptr) {
        continue;
      }
      printf("  0x%x-0x%x\n", (i << 22) + (j << 12),
             (i << 22) + ((j + 1) << 12));
    }
  }
}